

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_build_tls12_export_params
              (ptls_context_t *ctx,ptls_buffer_t *output,int is_server,int session_reused,
              ptls_cipher_suite_t *cipher,void *master_secret,void *hello_randoms,
              uint64_t next_send_record_iv,char *server_name,ptls_iovec_t negotiated_protocol)

{
  ptls_hash_algorithm_t *algo;
  void **ppvVar1;
  ulong outlen;
  ptls_iovec_t secret;
  ptls_iovec_t seed;
  void **local_168;
  anon_struct_16_2_c960e6e5 *dec_secret;
  anon_struct_16_2_c960e6e5 *enc_secret;
  anon_struct_16_2_c960e6e5 server_secret;
  anon_struct_16_2_c960e6e5 client_secret;
  int local_e4;
  int ret;
  size_t key_block_len;
  uint8_t key_block [128];
  void *master_secret_local;
  ptls_cipher_suite_t *cipher_local;
  int session_reused_local;
  int is_server_local;
  ptls_buffer_t *output_local;
  ptls_context_t *ctx_local;
  
  if ((cipher->aead->tls12).fixed_iv_size + (cipher->aead->tls12).record_iv_size == 0) {
    __assert_fail("cipher->aead->tls12.fixed_iv_size + cipher->aead->tls12.record_iv_size != 0 || !\"given cipher-suite supports TLS/1.2\""
                  ,"/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c",
                  0x147a,
                  "int ptls_build_tls12_export_params(ptls_context_t *, ptls_buffer_t *, int, int, ptls_cipher_suite_t *, const void *, const void *, uint64_t, const char *, ptls_iovec_t)"
                 );
  }
  outlen = (cipher->aead->key_size + (cipher->aead->tls12).fixed_iv_size) * 2;
  if (outlen < 0x81) {
    algo = cipher->hash;
    secret = ptls_iovec_init(master_secret,0x30);
    seed = ptls_iovec_init(hello_randoms,0x40);
    local_e4 = ptls_tls12_phash(algo,&key_block_len,outlen,secret,"key expansion",seed);
    if (local_e4 == 0) {
      if (is_server == 0) {
        ppvVar1 = &server_secret.iv;
        local_168 = &enc_secret;
      }
      else {
        ppvVar1 = &enc_secret;
        local_168 = &server_secret.iv;
      }
      server_secret.iv = &key_block_len;
      enc_secret = (anon_struct_16_2_c960e6e5 *)(key_block + (cipher->aead->key_size - 8));
      server_secret.key =
           key_block + (cipher->aead->tls12).fixed_iv_size + cipher->aead->key_size * 2 + -8;
      local_e4 = export_tls12_params(output,is_server,session_reused,cipher,
                                     (void *)((long)hello_randoms + 0x20),server_name,
                                     negotiated_protocol,(anon_struct_16_2_c960e6e5 *)*ppvVar1,
                                     (anon_struct_16_2_c960e6e5 *)ppvVar1[1],1,next_send_record_iv,
                                     *local_168,local_168[1],1);
    }
    (*ptls_clear_memory)(&key_block_len,0x80);
    return local_e4;
  }
  __assert_fail("key_block_len <= sizeof(key_block)",
                "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c",
                0x1480,
                "int ptls_build_tls12_export_params(ptls_context_t *, ptls_buffer_t *, int, int, ptls_cipher_suite_t *, const void *, const void *, uint64_t, const char *, ptls_iovec_t)"
               );
}

Assistant:

int ptls_build_tls12_export_params(ptls_context_t *ctx, ptls_buffer_t *output, int is_server, int session_reused,
                                   ptls_cipher_suite_t *cipher, const void *master_secret, const void *hello_randoms,
                                   uint64_t next_send_record_iv, const char *server_name, ptls_iovec_t negotiated_protocol)
{
    assert(cipher->aead->tls12.fixed_iv_size + cipher->aead->tls12.record_iv_size != 0 || !"given cipher-suite supports TLS/1.2");

    uint8_t key_block[(PTLS_MAX_SECRET_SIZE + PTLS_MAX_IV_SIZE) * 2];
    size_t key_block_len = (cipher->aead->key_size + cipher->aead->tls12.fixed_iv_size) * 2;
    int ret;

    assert(key_block_len <= sizeof(key_block));

    /* generate key block */
    if ((ret =
             ptls_tls12_phash(cipher->hash, key_block, key_block_len, ptls_iovec_init(master_secret, PTLS_TLS12_MASTER_SECRET_SIZE),
                              "key expansion", ptls_iovec_init(hello_randoms, PTLS_HELLO_RANDOM_SIZE * 2))) != 0)
        goto Exit;

    /* determine key locations */
    struct {
        const void *key;
        const void *iv;
    } client_secret, server_secret, *enc_secret = is_server ? &server_secret : &client_secret,
                                    *dec_secret = is_server ? &client_secret : &server_secret;
    client_secret.key = key_block;
    server_secret.key = key_block + cipher->aead->key_size;
    client_secret.iv = key_block + cipher->aead->key_size * 2;
    server_secret.iv = key_block + cipher->aead->key_size * 2 + cipher->aead->tls12.fixed_iv_size;

    /* Serialize prams. Sequence number of the first application record is 1, because Finished is the only message sent after
     * ChangeCipherSpec. */
    ret = export_tls12_params(output, is_server, session_reused, cipher, (uint8_t *)hello_randoms + PTLS_HELLO_RANDOM_SIZE,
                              server_name, negotiated_protocol, enc_secret->key, enc_secret->iv, 1, next_send_record_iv,
                              dec_secret->key, dec_secret->iv, 1);

Exit:
    ptls_clear_memory(key_block, sizeof(key_block));
    return ret;
}